

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O0

smf_tempo_t * smf_get_tempo_by_pulses(smf_t *smf,int pulses)

{
  smf_tempo_t *tempo;
  int i;
  int pulses_local;
  smf_t *smf_local;
  
  if (pulses < 0) {
    __assert_fail("pulses >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x114,"smf_tempo_t *smf_get_tempo_by_pulses(const smf_t *, int)");
  }
  if (pulses == 0) {
    smf_local = (smf_t *)smf_get_tempo_by_number(smf,0);
  }
  else {
    if (smf->tempo_array == (GPtrArray *)0x0) {
      __assert_fail("smf->tempo_array != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x119,"smf_tempo_t *smf_get_tempo_by_pulses(const smf_t *, int)");
    }
    tempo._0_4_ = smf->tempo_array->len;
    do {
      tempo._0_4_ = (guint)tempo - 1;
      if ((int)(guint)tempo < 0) {
        return (smf_tempo_t *)0x0;
      }
      smf_local = (smf_t *)smf_get_tempo_by_number(smf,(guint)tempo);
      if (smf_local == (smf_t *)0x0) {
        __assert_fail("tempo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                      ,0x11e,"smf_tempo_t *smf_get_tempo_by_pulses(const smf_t *, int)");
      }
    } while (pulses <= smf_local->format);
  }
  return (smf_tempo_t *)smf_local;
}

Assistant:

smf_tempo_t *
smf_get_tempo_by_pulses(const smf_t *smf, int pulses)
{
	int i;
	smf_tempo_t *tempo;

	assert(pulses >= 0);

	if (pulses == 0)
		return (smf_get_tempo_by_number(smf, 0));

	assert(smf->tempo_array != NULL);
	
	for (i = smf->tempo_array->len - 1; i >= 0; i--) {
		tempo = smf_get_tempo_by_number(smf, i);

		assert(tempo);
		if (tempo->time_pulses < pulses)
			return (tempo);
	}

	return (NULL);
}